

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_string_ops.hpp
# Opt level: O2

size_t gmlc::utilities::getChunkEnd<std::basic_string_view<char,std::char_traits<char>>>
                 (size_t start,basic_string_view<char,_std::char_traits<char>_> *str,char ChunkStart
                 ,char ChunkEnd)

{
  size_type sVar1;
  size_type sVar2;
  int iVar3;
  
  iVar3 = 1;
  while( true ) {
    if (iVar3 < 1) {
      return start;
    }
    sVar1 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      ((basic_string_view<char,_std::char_traits<char>_> *)str,ChunkStart,start + 1)
    ;
    sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::find
                      ((basic_string_view<char,_std::char_traits<char>_> *)str,ChunkEnd,start + 1);
    if (sVar2 == 0xffffffffffffffff) break;
    start = sVar2;
    if (sVar1 < sVar2) {
      start = sVar1;
    }
    iVar3 = iVar3 + ((sVar1 < sVar2) - 1 | 1);
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t getChunkEnd(size_t start, const X& str, char ChunkStart, char ChunkEnd)
{
    int open = 1;
    size_t rlc = start;

    while (open > 0) {
        auto newOpen = str.find_first_of(ChunkStart, rlc + 1);
        auto newClose = str.find_first_of(ChunkEnd, rlc + 1);
        if (newClose == X::npos) {
            rlc = X::npos;
            break;
        }
        if (newOpen < newClose) {
            ++open;
            rlc = newOpen;
        } else {
            --open;
            rlc = newClose;
        }
    }
    return rlc;
}